

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O2

string * soul::makeIdentifierRemovingColons(string *__return_storage_ptr__,string *s)

{
  string_view firstToReplace;
  string_view in_stack_ffffffffffffffa8;
  string local_30;
  
  trimCharacterAtStart(&local_30,s,':');
  firstToReplace._M_str = (char *)0x1;
  firstToReplace._M_len = (size_t)"::";
  choc::text::replace<std::__cxx11::string>
            ((string *)&stack0xffffffffffffffb0,(text *)&local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2,firstToReplace
             ,in_stack_ffffffffffffffa8);
  makeSafeIdentifierName(__return_storage_ptr__,(string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string makeIdentifierRemovingColons (std::string s)
{
    return makeSafeIdentifierName (choc::text::replace (trimCharacterAtStart (s, ':'), "::", "_"));
}